

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.h
# Opt level: O0

void __thiscall
QAccessibleValueInterface::QAccessibleValueInterface(QAccessibleValueInterface *this)

{
  QAccessibleValueInterface *this_local;
  
  *(undefined **)this = &QAccessibleTableModelChangeEvent::vtable;
  return;
}

Assistant:

class Q_GUI_EXPORT QAccessibleValueInterface
{
public:
    virtual ~QAccessibleValueInterface();

    virtual QVariant currentValue() const = 0;
    virtual void setCurrentValue(const QVariant &value) = 0;
    virtual QVariant maximumValue() const = 0;
    virtual QVariant minimumValue() const = 0;
    virtual QVariant minimumStepSize() const = 0;
}